

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TCPServer.cpp
# Opt level: O3

void __thiscall TCPServer::on_input(TCPServer *this,Poll *p)

{
  int iVar1;
  string *psVar2;
  ostream *poVar3;
  int *piVar4;
  undefined8 uVar5;
  shared_ptr<Subscriber> session;
  sockaddr_in client;
  socklen_t local_7c;
  _Any_data local_78;
  shared_ptr<Subscriber> local_68;
  sockaddr local_58;
  sockaddr local_48;
  
  local_7c = 0x10;
  iVar1 = Subscriber::get_fd(&this->super_Subscriber);
  iVar1 = accept(iVar1,&local_58,&local_7c);
  if (0 < iVar1) {
    do {
      local_48.sa_family = local_58.sa_family;
      local_48.sa_data[0] = local_58.sa_data[0];
      local_48.sa_data[1] = local_58.sa_data[1];
      local_48.sa_data[2] = local_58.sa_data[2];
      local_48.sa_data[3] = local_58.sa_data[3];
      local_48.sa_data[4] = local_58.sa_data[4];
      local_48.sa_data[5] = local_58.sa_data[5];
      local_48.sa_data[6] = local_58.sa_data[6];
      local_48.sa_data[7] = local_58.sa_data[7];
      local_48.sa_data[8] = local_58.sa_data[8];
      local_48.sa_data[9] = local_58.sa_data[9];
      local_48.sa_data[10] = local_58.sa_data[10];
      local_48.sa_data[0xb] = local_58.sa_data[0xb];
      local_48.sa_data[0xc] = local_58.sa_data[0xc];
      local_48.sa_data[0xd] = local_58.sa_data[0xd];
      if ((this->client_factory).super__Function_base._M_manager == (_Manager_type)0x0) {
        uVar5 = std::__throw_bad_function_call();
        if (local_68.super___shared_ptr<Subscriber,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_68.super___shared_ptr<Subscriber,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                     ._M_pi);
        }
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_78._8_8_ !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_78._8_8_);
        }
        _Unwind_Resume(uVar5);
      }
      (*(this->client_factory)._M_invoker)
                (&local_78,(Poll *)&this->client_factory,(TCPServer *)p,(sockaddr_in *)this);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"Started new tcp session ",0x18);
      psVar2 = Subscriber::get_name_abi_cxx11_((Subscriber *)local_78._M_unused._0_8_);
      poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cout,(psVar2->_M_dataplus)._M_p,psVar2->_M_string_length)
      ;
      std::ios::widen((char)poVar3->_vptr_basic_ostream[-3] + (char)poVar3);
      std::ostream::put((char)poVar3);
      std::ostream::flush();
      Subscriber::set_fd((Subscriber *)local_78._M_unused._0_8_,iVar1);
      local_68.super___shared_ptr<Subscriber,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)local_78._M_unused._0_8_;
      local_68.super___shared_ptr<Subscriber,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_78._8_8_;
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_78._8_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          *(_Atomic_word *)(local_78._8_8_ + 8) = *(_Atomic_word *)(local_78._8_8_ + 8) + 1;
          UNLOCK();
        }
        else {
          *(_Atomic_word *)(local_78._8_8_ + 8) = *(_Atomic_word *)(local_78._8_8_ + 8) + 1;
        }
      }
      Poll::subscribe(p,&local_68);
      if (local_68.super___shared_ptr<Subscriber,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_68.super___shared_ptr<Subscriber,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                   _M_pi);
      }
      poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cout,(this->super_Subscriber).name._M_dataplus._M_p,
                          (this->super_Subscriber).name._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,": new connection",0x10);
      std::ios::widen((char)poVar3->_vptr_basic_ostream[-3] + (char)poVar3);
      std::ostream::put((char)poVar3);
      std::ostream::flush();
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_78._8_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_78._8_8_);
      }
      local_7c = 0x10;
      iVar1 = Subscriber::get_fd(&this->super_Subscriber);
      iVar1 = accept(iVar1,&local_58,&local_7c);
    } while (0 < iVar1);
  }
  if (iVar1 < 0) {
    piVar4 = __errno_location();
    if (*piVar4 != 0xb) {
      no_err(-1,"accept failed");
    }
  }
  return;
}

Assistant:

void TCPServer::on_input(Poll &p) {
  int connected_fd;
  do {
    struct sockaddr_in client;
    socklen_t client_len = sizeof(client);
    connected_fd = accept(this->get_fd(), (struct sockaddr *) &client, &client_len);
    if (connected_fd > 0) {
      std::shared_ptr<Subscriber> session = client_factory(p, *this, client);
      std::cout << "Started new tcp session " << session->get_name() << std::endl;
      session->set_fd(connected_fd);
      p.subscribe(session);
      std::cout << this->name << ": new connection" << std::endl;
    }
  } while (connected_fd > 0);
  if (connected_fd < 0 && errno != EWOULDBLOCK) {
    no_err(-1, "accept failed");
  }
}